

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::LWO::AnimResolver::ExtractAnimChannel(AnimResolver *this,aiNodeAnim **out,uint flags)

{
  bool bVar1;
  bool bVar2;
  aiVector3t<float> axis;
  aiVector3t<float> axis_00;
  aiVector3t<float> axis_01;
  pointer paVar3;
  float fVar4;
  bool bVar5;
  size_type sVar6;
  aiNodeAnim *this_00;
  ulong uVar7;
  aiVectorKey *paVar8;
  iterator iVar9;
  iterator iVar10;
  aiQuatKey *paVar11;
  reference pvVar12;
  aiQuaterniont<float> aVar13;
  aiVectorKey *local_268;
  aiQuatKey *local_1f0;
  aiVectorKey *local_1b8;
  undefined1 local_170 [8];
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys_2;
  aiQuaterniont<float> local_138;
  float local_128;
  float fStack_124;
  float local_120;
  float local_118;
  float fStack_114;
  float local_110;
  aiQuaterniont<float> local_108;
  float local_f8;
  float fStack_f4;
  float local_f0;
  float local_e8;
  float fStack_e4;
  float local_e0;
  aiQuaterniont<float> local_d8;
  aiQuaterniont<float> local_c8;
  double local_b8;
  double local_b0;
  double *local_a8;
  aiQuatKey *qk;
  uint i;
  aiVector3D Z;
  aiVector3D Y;
  aiVector3D X;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys_1;
  undefined1 local_40 [8];
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys;
  aiNodeAnim *anim;
  bool scale;
  bool rotat;
  bool trans;
  uint flags_local;
  aiNodeAnim **out_local;
  AnimResolver *this_local;
  
  *out = (aiNodeAnim *)0x0;
  bVar5 = std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::empty
                    (this->envelopes);
  if (bVar5) {
    return;
  }
  if (this->trans_x == (Envelope *)0x0) {
LAB_00b65ac2:
    if (this->trans_y != (Envelope *)0x0) {
      sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                        (&this->trans_y->keys);
      bVar5 = true;
      if (1 < sVar6) goto LAB_00b65b38;
    }
    bVar5 = false;
    if (this->trans_z != (Envelope *)0x0) {
      sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                        (&this->trans_z->keys);
      bVar5 = 1 < sVar6;
    }
  }
  else {
    sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                      (&this->trans_x->keys);
    bVar5 = true;
    if (sVar6 < 2) goto LAB_00b65ac2;
  }
LAB_00b65b38:
  if (this->rotat_x == (Envelope *)0x0) {
LAB_00b65b77:
    if (this->rotat_y != (Envelope *)0x0) {
      sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                        (&this->rotat_y->keys);
      bVar1 = true;
      if (1 < sVar6) goto LAB_00b65bed;
    }
    bVar1 = false;
    if (this->rotat_z != (Envelope *)0x0) {
      sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                        (&this->rotat_z->keys);
      bVar1 = 1 < sVar6;
    }
  }
  else {
    sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                      (&this->rotat_x->keys);
    bVar1 = true;
    if (sVar6 < 2) goto LAB_00b65b77;
  }
LAB_00b65bed:
  if (this->scale_x != (Envelope *)0x0) {
    sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                      (&this->scale_x->keys);
    bVar2 = true;
    if (1 < sVar6) goto LAB_00b65ca2;
  }
  if (this->scale_y != (Envelope *)0x0) {
    sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                      (&this->scale_y->keys);
    bVar2 = true;
    if (1 < sVar6) goto LAB_00b65ca2;
  }
  bVar2 = false;
  if (this->scale_z != (Envelope *)0x0) {
    sVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                      (&this->scale_z->keys);
    bVar2 = 1 < sVar6;
  }
LAB_00b65ca2:
  if (((bVar5) || (bVar1)) || (bVar2)) {
    this_00 = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this_00);
    *out = this_00;
    keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
    if ((this->need_to_setup & 1U) != 0) {
      UpdateAnimRangeSetup(this);
      this->need_to_setup = false;
    }
    if (bVar5) {
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40);
      GetKeys(this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40,this->trans_x,
              this->trans_y,this->trans_z,flags);
      sVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40);
      *(int *)&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0x2a].field_0x14 = (int)sVar6;
      uVar7 = sVar6 & 0xffffffff;
      paVar8 = (aiVectorKey *)operator_new__(uVar7 * 0x18);
      if (uVar7 != 0) {
        local_1b8 = paVar8;
        do {
          aiVectorKey::aiVectorKey(local_1b8);
          local_1b8 = local_1b8 + 1;
        } while (local_1b8 != paVar8 + uVar7);
      }
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x2b].mTime = (double)paVar8;
      iVar9 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40);
      iVar10 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end
                         ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*>
                ((__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                  )iVar9._M_current,
                 (__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                  )iVar10._M_current,
                 (aiVectorKey *)
                 keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0x2b].mTime);
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_40);
    }
    if (bVar1) {
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y);
      GetKeys(this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y,this->rotat_x,
              this->rotat_y,this->rotat_z,flags);
      sVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y);
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x2b].mValue.x = (float)sVar6;
      uVar7 = sVar6 & 0xffffffff;
      paVar11 = (aiQuatKey *)operator_new__(uVar7 * 0x18);
      if (uVar7 != 0) {
        local_1f0 = paVar11;
        do {
          aiQuatKey::aiQuatKey(local_1f0);
          local_1f0 = local_1f0 + 1;
        } while (local_1f0 != paVar11 + uVar7);
      }
      *(aiQuatKey **)
       &keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x2b].mValue.z = paVar11;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&Y.y,1.0,0.0,0.0);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&Z.y,0.0,1.0,0.0);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&qk + 4),0.0,0.0,1.0);
      for (qk._0_4_ = 0.0;
          (uint)qk._0_4_ <
          (uint)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[0x2b].mValue.x;
          qk._0_4_ = (float)((int)qk._0_4_ + 1)) {
        local_a8 = (double *)
                   (*(long *)&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[0x2b].mValue.z +
                   (ulong)(uint)qk._0_4_ * 0x18);
        pvVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y,
                             (ulong)(uint)qk._0_4_);
        *local_a8 = pvVar12->mTime;
        local_e0 = Y.x;
        local_e8 = Z.y;
        fStack_e4 = Z.z;
        pvVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y,
                             (ulong)(uint)qk._0_4_);
        local_f0 = local_e0;
        local_f8 = local_e8;
        fStack_f4 = fStack_e4;
        axis_01.z = local_e0;
        axis_01.x = local_e8;
        axis_01.y = fStack_e4;
        aiQuaterniont<float>::aiQuaterniont(&local_d8,axis_01,(pvVar12->mValue).x);
        local_110 = X.x;
        local_118 = Y.y;
        fStack_114 = Y.z;
        pvVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y,
                             (ulong)(uint)qk._0_4_);
        local_120 = local_110;
        local_128 = local_118;
        fStack_124 = fStack_114;
        axis_00.z = local_110;
        axis_00.x = local_118;
        axis_00.y = fStack_114;
        aiQuaterniont<float>::aiQuaterniont(&local_108,axis_00,(pvVar12->mValue).y);
        aVar13 = aiQuaterniont<float>::operator*(&local_d8,&local_108);
        fVar4 = Z.x;
        paVar3 = stack0xffffffffffffff64;
        local_c8._8_8_ = aVar13._8_8_;
        local_c8._0_8_ = aVar13._0_8_;
        pvVar12 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y,
                             (ulong)(uint)qk._0_4_);
        keys_2.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = paVar3;
        axis.z = fVar4;
        axis._0_8_ = paVar3;
        aiQuaterniont<float>::aiQuaterniont(&local_138,axis,(pvVar12->mValue).z);
        aVar13 = aiQuaterniont<float>::operator*(&local_c8,&local_138);
        local_b0 = aVar13._8_8_;
        local_b8 = aVar13._0_8_;
        local_a8[1] = local_b8;
        local_a8[2] = local_b0;
      }
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)&X.y);
    }
    if (bVar2) {
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170);
      GetKeys(this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170,this->scale_x,
              this->scale_y,this->scale_z,flags);
      sVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170);
      *(int *)&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0x2c].mTime = (int)sVar6;
      uVar7 = sVar6 & 0xffffffff;
      paVar8 = (aiVectorKey *)operator_new__(uVar7 * 0x18);
      if (uVar7 != 0) {
        local_268 = paVar8;
        do {
          aiVectorKey::aiVectorKey(local_268);
          local_268 = local_268 + 1;
        } while (local_268 != paVar8 + uVar7);
      }
      *(aiVectorKey **)
       &keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x2c].mValue = paVar8;
      iVar9 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170);
      iVar10 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end
                         ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*>
                ((__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                  )iVar9._M_current,
                 (__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                  )iVar10._M_current,
                 *(aiVectorKey **)
                  &keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[0x2c].mValue);
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)local_170);
    }
  }
  return;
}

Assistant:

void AnimResolver::ExtractAnimChannel(aiNodeAnim** out, unsigned int flags /*= 0*/)
{
    *out = NULL;


    //FIXME: crashes if more than one component is animated at different timings, to be resolved.

    // If we have no envelopes, return NULL
    if (envelopes.empty()) {
        return;
    }

    // We won't spawn an animation channel if we don't have at least one envelope with more than one keyframe defined.
    const bool trans = ((trans_x && trans_x->keys.size() > 1) || (trans_y && trans_y->keys.size() > 1) || (trans_z && trans_z->keys.size() > 1));
    const bool rotat = ((rotat_x && rotat_x->keys.size() > 1) || (rotat_y && rotat_y->keys.size() > 1) || (rotat_z && rotat_z->keys.size() > 1));
    const bool scale = ((scale_x && scale_x->keys.size() > 1) || (scale_y && scale_y->keys.size() > 1) || (scale_z && scale_z->keys.size() > 1));
    if (!trans && !rotat && !scale)
        return;

    // Allocate the output animation
    aiNodeAnim* anim = *out = new aiNodeAnim();

    // Setup default animation setup if necessary
    if (need_to_setup) {
        UpdateAnimRangeSetup();
        need_to_setup = false;
    }

    // copy translation keys
    if (trans) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,trans_x,trans_y,trans_z,flags);

        anim->mPositionKeys = new aiVectorKey[ anim->mNumPositionKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mPositionKeys);
    }

    // copy rotation keys
    if (rotat) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,rotat_x,rotat_y,rotat_z,flags);

        anim->mRotationKeys = new aiQuatKey[ anim->mNumRotationKeys = static_cast<unsigned int>(keys.size()) ];

        // convert heading, pitch, bank to quaternion
        // mValue.x=Heading=Rot(Y), mValue.y=Pitch=Rot(X), mValue.z=Bank=Rot(Z)
        // Lightwave's rotation order is ZXY
        aiVector3D X(1.0,0.0,0.0);
        aiVector3D Y(0.0,1.0,0.0);
        aiVector3D Z(0.0,0.0,1.0);
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            aiQuatKey& qk = anim->mRotationKeys[i];
            qk.mTime  = keys[i].mTime;
            qk.mValue = aiQuaternion(Y,keys[i].mValue.x)*aiQuaternion(X,keys[i].mValue.y)*aiQuaternion(Z,keys[i].mValue.z);
        }
    }

    // copy scaling keys
    if (scale) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,scale_x,scale_y,scale_z,flags);

        anim->mScalingKeys = new aiVectorKey[ anim->mNumScalingKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mScalingKeys);
    }
}